

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_schematron(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  xmlDocPtr pxVar4;
  int nr;
  int test_ret;
  uint uVar5;
  xmlDocPtr in_RSI;
  xmlDocPtr pxVar6;
  int no;
  
  if (quiet == '\0') {
    puts("Testing schematron : 1 of 10 functions ...");
  }
  bVar1 = true;
  uVar5 = 0;
  while (bVar1) {
    pxVar6 = (xmlDocPtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      no = (int)pxVar6;
      if (no == 4) break;
      iVar2 = xmlMemBlocks();
      pxVar4 = gen_xmlDocPtr(no,iVar3);
      in_RSI = pxVar4;
      xmlSchematronValidateDoc(0);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar4,in_RSI,nr);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchematronValidateDoc",(ulong)(uint)(iVar3 - iVar2));
        uVar5 = uVar5 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar6;
      }
      pxVar6 = (xmlDocPtr)(ulong)(no + 1);
    }
    bVar1 = false;
  }
  function_tests = function_tests + 1;
  if (uVar5 != 0) {
    printf("Module schematron: %d errors\n",(ulong)uVar5);
  }
  return uVar5;
}

Assistant:

static int
test_schematron(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing schematron : 1 of 10 functions ...\n");
    test_ret += test_xmlSchematronNewDocParserCtxt();
    test_ret += test_xmlSchematronNewMemParserCtxt();
    test_ret += test_xmlSchematronNewParserCtxt();
    test_ret += test_xmlSchematronNewValidCtxt();
    test_ret += test_xmlSchematronParse();
    test_ret += test_xmlSchematronSetValidStructuredErrors();
    test_ret += test_xmlSchematronValidateDoc();

    if (test_ret != 0)
	printf("Module schematron: %d errors\n", test_ret);
    return(test_ret);
}